

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

void duckdb_je_tcache_bin_flush_large
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,uint rem)

{
  char cVar1;
  uint64_t uVar2;
  edata_t *peVar3;
  malloc_mutex_t *pmVar4;
  void **ppvVar5;
  ticker_geom_t *ticker;
  uint64_t *prng_state;
  _Bool _Var6;
  ulong uVar7;
  undefined8 *nflush;
  int iVar8;
  undefined8 *extraout_RDX;
  undefined8 *puVar9;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  ulong uVar10;
  arena_t *paVar11;
  uint uVar12;
  uint uVar13;
  emap_batch_lookup_result_t *edatas;
  uint i;
  ulong uVar14;
  cache_bin_ptr_array_t local_c8;
  arena_t *local_b8;
  ticker_geom_t *local_b0;
  uint64_t *local_a8;
  ulong local_a0;
  ulong local_98;
  undefined1 *local_90;
  tcache_t *local_88;
  long local_80;
  cache_bin_ptr_array_t *local_78;
  long local_70;
  tsd_t *local_68;
  arena_t *local_60;
  undefined8 *local_58;
  arena_stats_large_t *lstats;
  cache_bin_t *local_48;
  undefined8 *local_40;
  uint local_34;
  
  edatas = (emap_batch_lookup_result_t *)0x0;
  local_88 = tcache;
  duckdb_je_tcache_bin_flush_stashed(tsd,tcache,cache_bin,binind,false);
  uVar13 = *(int *)&cache_bin->low_bits_empty - (int)cache_bin->stack_head & 0xffff;
  uVar12 = uVar13 >> 3;
  if (uVar12 < (rem & 0xffff)) {
    rem = uVar12;
  }
  uVar12 = uVar12 - rem & 0xffff;
  local_78 = (cache_bin_ptr_array_t *)(ulong)uVar12;
  uVar7 = 0;
  local_80 = (long)cache_bin->stack_head + ((ulong)uVar13 - (ulong)(uVar12 * 8));
  local_b0 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
  local_a8 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state;
  local_70 = ((ulong)binind - 0x24) * 0x30;
  local_90 = (undefined1 *)&local_c8;
  local_68 = tsd;
  local_48 = cache_bin;
  do {
    uVar12 = (int)local_78 - (int)uVar7;
    if (0xff < uVar12) {
      uVar12 = 0x100;
    }
    local_c8.n = (cache_bin_sz_t)uVar12;
    local_c8.ptr = (void **)(local_80 + uVar7 * 8);
    paVar11 = local_88->tcache_slow->arena;
    nflush = (undefined8 *)(local_90 + -(ulong)(uVar12 * 8 + 0x17 & 0x1ff0));
    local_a0 = uVar7;
    local_40 = nflush;
    nflush[-1] = 0x1ea0247;
    tcache_bin_flush_edatas_lookup(tsd,&local_c8,uVar12,(size_t)nflush,edatas);
    local_58 = (undefined8 *)((long)&(paVar11->stats).lstats[0].nmalloc.val.repr + local_70);
    local_34 = 0;
    puVar9 = extraout_RDX;
    uVar7 = (ulong)uVar12;
    local_b8 = paVar11;
    local_98 = (ulong)uVar12;
    while (iVar8 = (int)uVar7, iVar8 != 0) {
      uVar12 = *(uint *)*local_40 & 0xfff;
      paVar11 = (arena_t *)duckdb_je_arenas[uVar12].repr;
      if (paVar11 == (arena_t *)0x0) {
        paVar11 = (arena_t *)0x0;
      }
      if (duckdb_je_manual_arena_base <= paVar11->ind) {
        nflush[-1] = 0x1ea02bf;
        malloc_mutex_lock((tsdn_t *)tsd,&paVar11->large_mtx);
      }
      if ((local_b8 == paVar11) && ((local_34 & 1) == 0)) {
        uVar2 = (local_48->tstats).nrequests;
        LOCK();
        local_58[2] = local_58[2] + uVar2;
        UNLOCK();
        LOCK();
        local_58[4] = local_58[4] + 1;
        UNLOCK();
        (local_48->tstats).nrequests = 0;
        local_34 = (uint)CONCAT71((int7)(uVar2 >> 8),1);
      }
      puVar9 = local_40;
      local_60 = paVar11;
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        peVar3 = (edata_t *)puVar9[uVar10];
        if (((uint)peVar3->e_bits & 0xfff) == uVar12) {
          nflush[-1] = 0x1ea031a;
          duckdb_je_large_dalloc_prep_locked((tsdn_t *)tsd,peVar3);
          puVar9 = local_40;
        }
      }
      lstats._4_4_ = iVar8;
      if (duckdb_je_manual_arena_base <= local_60->ind) {
        (local_60->large_mtx).field_0.field_0.locked.repr = false;
        pmVar4 = &local_60->large_mtx;
        nflush[-1] = 0x1ea034f;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar4->field_0 + 0x48));
        puVar9 = local_40;
      }
      ppvVar5 = local_c8.ptr;
      uVar14 = 0;
      for (uVar10 = 0; tsd = local_68, prng_state = local_a8, ticker = local_b0, uVar7 != uVar10;
          uVar10 = uVar10 + 1) {
        peVar3 = (edata_t *)puVar9[uVar10];
        if (((uint)peVar3->e_bits & 0xfff) == uVar12) {
          nflush[-1] = 0x1ea0380;
          duckdb_je_large_dalloc_finish((tsdn_t *)tsd,peVar3);
          puVar9 = local_40;
        }
        else {
          ppvVar5[uVar14] = ppvVar5[uVar10];
          puVar9[uVar14] = peVar3;
          uVar14 = (ulong)((int)uVar14 + 1);
        }
      }
      uVar7 = uVar14;
      if (local_68 != (tsd_t *)0x0) {
        iVar8 = lstats._4_4_ - (int)uVar14;
        cVar1 = local_68->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
        nflush[-1] = 0x1ea03cd;
        _Var6 = ticker_geom_ticks(ticker,prng_state,iVar8,'\0' < cVar1);
        paVar11 = local_60;
        puVar9 = extraout_RDX_00;
        if (_Var6) {
          nflush[-1] = 0x1ea03e5;
          duckdb_je_arena_decay((tsdn_t *)tsd,paVar11,false,false);
          puVar9 = extraout_RDX_01;
        }
      }
    }
    if ((local_34 & 1) == 0) {
      LOCK();
      local_58[2] = local_58[2] + (local_48->tstats).nrequests;
      UNLOCK();
      LOCK();
      local_58[4] = local_58[4] + 1;
      UNLOCK();
      (local_48->tstats).nrequests = 0;
      puVar9 = local_58;
    }
    uVar12 = (int)local_98 + (int)local_a0;
    uVar7 = (ulong)uVar12;
  } while (uVar12 < (uint)local_78);
  cache_bin_finish_flush(local_48,local_78,(cache_bin_sz_t)puVar9);
  return;
}

Assistant:

void
tcache_bin_flush_large(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, unsigned rem) {
	tcache_bin_flush_bottom(tsd, tcache, cache_bin, binind, rem,
	    /* small */ false);
}